

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  CURLM *multi;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uStack_30;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar5 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar5,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                  ,0x56,iVar1,uVar2);
    goto LAB_0010249f;
  }
  multi = (CURLM *)curl_multi_init();
  if (multi == (CURLM *)0x0) {
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                  ,0x58);
    iVar1 = 0x7b;
LAB_001023b4:
    lVar3 = 0;
  }
  else {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x5a);
      iVar1 = 0x7c;
      goto LAB_001023b4;
    }
    iVar1 = curl_multi_setopt(multi,3,1);
    uVar5 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x4e2b,fwrite);
      uVar5 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar4 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_30 = 0x5e;
        goto LAB_0010246b;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2d,1);
      uVar5 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar4 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_30 = 0x5f;
        goto LAB_0010246b;
      }
      iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
      uVar5 = _stderr;
      if (iVar1 != 0) {
        uVar2 = curl_easy_strerror(iVar1);
        pcVar4 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_30 = 0x60;
        goto LAB_0010246b;
      }
      iVar1 = curl_multi_add_handle(multi,lVar3);
      uVar5 = _stderr;
      if (iVar1 == 0) {
        iVar1 = perform(multi);
        if (iVar1 != 0) {
          pcVar4 = "retrieve 1 failed\n";
          goto LAB_0010250d;
        }
        curl_multi_remove_handle(multi,lVar3);
        curl_easy_reset(lVar3);
        iVar1 = curl_easy_setopt(lVar3,0x2d,1);
        uVar5 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_easy_strerror(iVar1);
          pcVar4 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_30 = 0x72;
          goto LAB_0010246b;
        }
        iVar1 = curl_easy_setopt(lVar3,0x2712,libtest_arg2);
        uVar5 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_easy_strerror(iVar1);
          pcVar4 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uStack_30 = 0x73;
          goto LAB_0010246b;
        }
        iVar1 = curl_multi_add_handle(multi,lVar3);
        uVar5 = _stderr;
        if (iVar1 != 0) {
          uVar2 = curl_multi_strerror(iVar1);
          curl_mfprintf(uVar5,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                        ,0x75,iVar1,uVar2);
          pcVar4 = "curl_multi_add_handle() 2 failed\n";
          goto LAB_0010250d;
        }
        iVar1 = perform(multi);
        if (iVar1 != 0) {
          pcVar4 = "retrieve 2 failed\n";
          goto LAB_0010250d;
        }
        curl_multi_remove_handle(multi,lVar3);
        iVar1 = 0;
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        curl_mfprintf(uVar5,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                      ,0x62,iVar1,uVar2);
        pcVar4 = "curl_multi_add_handle() 1 failed\n";
LAB_0010250d:
        curl_mprintf(pcVar4);
      }
    }
    else {
      uVar2 = curl_multi_strerror(iVar1);
      pcVar4 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
      uStack_30 = 0x5c;
LAB_0010246b:
      curl_mfprintf(uVar5,pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,uStack_30,iVar1,uVar2);
    }
  }
  curl_easy_cleanup(lVar3);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
  curl_mprintf("Finished!\n");
LAB_0010249f:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}